

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-quantize-stats.cpp
# Opt level: O2

void test_roundtrip_on_chunk
               (ggml_tensor *layer,int64_t offset,int64_t chunk_size,ggml_type_traits *qfns,
               ggml_type_traits_cpu *qfns_cpu,bool use_reference,float *input_scratch,
               char *quantized_scratch,float *output_scratch,error_stats *stats)

{
  double dVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  float fVar5;
  double local_58;
  double local_50;
  
  if (layer->type == GGML_TYPE_F16) {
    lVar4 = 0;
    lVar2 = 0;
    if (0 < chunk_size) {
      lVar2 = chunk_size;
    }
    for (; lVar2 != lVar4; lVar4 = lVar4 + 1) {
      fVar5 = (float)ggml_get_f32_1d(layer,(int)offset + (int)lVar4);
      input_scratch[lVar4] = fVar5;
    }
  }
  else {
    lVar2 = ggml_get_data_f32(layer);
    input_scratch = (float *)(lVar2 + offset * 4);
  }
  if (use_reference) {
    qfns_cpu = (ggml_type_traits_cpu *)&qfns->from_float_ref;
  }
  (*qfns_cpu->from_float)(input_scratch,quantized_scratch,chunk_size);
  (*qfns->to_float)(quantized_scratch,output_scratch,chunk_size);
  local_50 = stats->total_error;
  local_58 = stats->max_error;
  lVar4 = 0;
  lVar2 = 0;
  if (0 < chunk_size) {
    lVar2 = chunk_size;
  }
  for (; lVar2 != lVar4; lVar4 = lVar4 + 1) {
    dVar1 = (double)(input_scratch[lVar4] - output_scratch[lVar4]);
    local_50 = local_50 + dVar1 * dVar1;
    stats->total_error = local_50;
    local_58 = fmax(ABS(dVar1),local_58);
    stats->max_error = local_58;
    dVar1 = floor((ABS(dVar1) / 0.03) * 150.0);
    uVar3 = (long)(dVar1 - 9.223372036854776e+18) & (long)dVar1 >> 0x3f | (long)dVar1;
    if (0x94 < uVar3) {
      uVar3 = 0x95;
    }
    stats->error_histogram[uVar3 & 0xffffffff] = stats->error_histogram[uVar3 & 0xffffffff] + 1;
  }
  stats->num_samples = stats->num_samples + chunk_size;
  return;
}

Assistant:

static void test_roundtrip_on_chunk(
    const ggml_tensor * layer, int64_t offset, int64_t chunk_size, const ggml_type_traits & qfns, const ggml_type_traits_cpu & qfns_cpu, bool use_reference,
    float * input_scratch, char * quantized_scratch, float * output_scratch, error_stats & stats
) {
    if (layer->type == GGML_TYPE_F16) {
        for (int i = 0; i < chunk_size; i++) {
            input_scratch[i] = ggml_get_f32_1d(layer, i + offset);
        }
    } else {
        input_scratch = ggml_get_data_f32(layer) + offset;
    }

    if (use_reference) {
        qfns.from_float_ref(input_scratch, quantized_scratch, chunk_size);
    } else {
        qfns_cpu.from_float(input_scratch, quantized_scratch, chunk_size);
    }
    qfns.to_float(quantized_scratch, output_scratch, chunk_size);

    update_error_stats(chunk_size, input_scratch, output_scratch, stats);
}